

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles3::Functional::eval_refract_float(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = c->in[0].m_data[2];
  fVar2 = c->in[1].m_data[0];
  fVar3 = c->in[2].m_data[1];
  fVar6 = fVar1 * fVar2;
  fVar4 = 1.0 - fVar3 * fVar3 * (1.0 - fVar6 * fVar6);
  fVar5 = 0.0;
  if (0.0 <= fVar4) {
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar5 = fVar1 * fVar3 - fVar2 * (fVar6 * fVar3 + fVar4);
  }
  (c->color).m_data[0] = fVar5;
  return;
}

Assistant:

void eval_refract_float	(ShaderEvalContext& c) { c.color.x()	= refract(c.in[0].z(),                 c.in[1].x(),                 c.in[2].y()); }